

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

toml_type_t __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_date_or_number
          (parser_t<events_aggregator_t> *this)

{
  char *pcVar1;
  size_t sVar2;
  vector<sax_event_t,std::allocator<sax_event_t>> *this_00;
  char cVar3;
  char cVar4;
  int iVar5;
  undefined8 *puVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  char *end;
  char buffer [801];
  undefined8 local_550;
  undefined1 *local_548;
  undefined8 local_540;
  undefined1 local_538;
  undefined7 uStack_537;
  undefined8 uStack_530;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518;
  undefined7 uStack_517;
  undefined8 uStack_510;
  undefined1 *local_508;
  undefined8 local_500;
  undefined1 local_4f8;
  undefined7 uStack_4f7;
  undefined8 uStack_4f0;
  undefined1 *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8;
  undefined7 uStack_4d7;
  undefined8 uStack_4d0;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  undefined8 uStack_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  undefined8 uStack_490;
  undefined1 *local_488;
  undefined8 local_480;
  undefined1 local_478;
  undefined7 uStack_477;
  undefined8 uStack_470;
  undefined1 *local_468;
  undefined8 local_460;
  undefined1 local_458;
  undefined7 uStack_457;
  undefined8 uStack_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined1 local_438;
  undefined7 uStack_437;
  undefined8 uStack_430;
  undefined1 *local_428;
  undefined8 local_420;
  undefined1 local_418;
  undefined7 uStack_417;
  undefined8 uStack_410;
  undefined1 *local_408;
  undefined8 local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  undefined8 uStack_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  undefined8 uStack_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8;
  undefined7 uStack_3b7;
  undefined8 uStack_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 local_398;
  undefined7 uStack_397;
  undefined8 uStack_390;
  size_t local_388;
  type_t local_37c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  char local_358 [808];
  
  sVar2 = (this->input).m_processed;
  pcVar7 = local_358 + 1;
  local_358[0] = '+';
  cVar3 = input_stream_t::peek(&this->input);
  bVar12 = (int)cVar3 - 0x30U < 10;
  if (bVar12) {
    local_358[1] = input_stream_t::get(&this->input);
    cVar3 = input_stream_t::peek(&this->input);
    uVar10 = 1;
    if ((int)cVar3 - 0x30U < 10) {
      local_358[2] = input_stream_t::get(&this->input);
      cVar3 = input_stream_t::peek(&this->input);
      uVar10 = 2;
      if ((int)cVar3 - 0x30U < 10) {
        local_358[3] = input_stream_t::get(&this->input);
        cVar3 = input_stream_t::peek(&this->input);
        uVar10 = 3;
        if ((int)cVar3 - 0x30U < 10) {
          local_358[4] = input_stream_t::get(&this->input);
          cVar3 = input_stream_t::peek(&this->input);
          uVar10 = 4;
          if (cVar3 == '-') {
            local_358[5] = input_stream_t::get(&this->input);
            local_358[6] = parse_datetime_digit(this);
            local_358[7] = parse_datetime_digit(this);
            local_358[8] = parse_chars<2ul>(this,(char (*) [2])0x18cbd4);
            local_358[9] = parse_datetime_digit(this);
            local_358[10] = parse_datetime_digit(this);
            local_358[0xb] = parse_chars<3ul>(this,(char (*) [3])"tT");
            local_358[0xc] = parse_datetime_digit(this);
            local_358[0xd] = parse_datetime_digit(this);
            local_358[0xe] = parse_chars<2ul>(this,(char (*) [2])0x194f2d);
            local_358[0xf] = parse_datetime_digit(this);
            local_358[0x10] = parse_datetime_digit(this);
            local_358[0x11] = parse_chars<2ul>(this,(char (*) [2])0x194f2d);
            local_358[0x12] = parse_datetime_digit(this);
            local_358[0x13] = parse_datetime_digit(this);
            cVar3 = input_stream_t::peek(&this->input);
            lVar11 = 0x13;
            if (cVar3 == '.') {
              local_358[0x14] = input_stream_t::get(&this->input);
              local_358[0x15] = parse_datetime_digit(this);
              cVar3 = input_stream_t::peek(&this->input);
              lVar11 = 0x15;
              while ((int)cVar3 - 0x30U < 10) {
                cVar3 = input_stream_t::get(&this->input);
                local_358[lVar11 + 1] = cVar3;
                lVar11 = lVar11 + 1;
                cVar3 = input_stream_t::peek(&this->input);
              }
            }
            cVar3 = input_stream_t::peek(&this->input);
            if ((cVar3 == 'z') || (cVar3 = input_stream_t::peek(&this->input), cVar3 == 'Z')) {
              cVar3 = input_stream_t::get(&this->input);
              local_358[lVar11 + 1] = cVar3;
              lVar11 = lVar11 + 1;
            }
            else {
              cVar3 = parse_chars<3ul>(this,(char (*) [3])"+-");
              local_358[lVar11 + 1] = cVar3;
              cVar3 = parse_datetime_digit(this);
              local_358[lVar11 + 2] = cVar3;
              cVar3 = parse_datetime_digit(this);
              local_358[lVar11 + 3] = cVar3;
              cVar3 = parse_chars<2ul>(this,(char (*) [2])0x194f2d);
              local_358[lVar11 + 4] = cVar3;
              cVar3 = parse_datetime_digit(this);
              local_358[lVar11 + 5] = cVar3;
              cVar3 = parse_datetime_digit(this);
              local_358[lVar11 + 6] = cVar3;
              lVar11 = lVar11 + 6;
            }
            this_00 = (vector<sax_event_t,std::allocator<sax_event_t>> *)this->handler;
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_378,pcVar7,pcVar7 + lVar11);
            local_550 = (char *)CONCAT44(local_550._4_4_,0xd);
            std::vector<sax_event_t,std::allocator<sax_event_t>>::
            emplace_back<sax_event_t::type_t,std::__cxx11::string_const&>
                      (this_00,(type_t *)&local_550,&local_378);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p);
            }
            return datetime;
          }
        }
      }
    }
  }
  else {
    cVar3 = input_stream_t::peek(&this->input);
    if (cVar3 == '-') {
      input_stream_t::get(&this->input);
      local_358[0] = '-';
    }
    else {
      cVar3 = input_stream_t::peek(&this->input);
      input_stream_t::get(&this->input);
      if (cVar3 != '+') {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_3a8 = &local_398;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3a8,"Unexpected character","");
        sVar2 = (this->input).m_processed;
        lVar11 = 0;
        if (sVar2 != 0) {
          lVar11 = sVar2 - 1;
        }
        *puVar6 = &PTR__parser_error_t_001af398;
        puVar6[1] = puVar6 + 3;
        if (local_3a8 == &local_398) {
          puVar6[3] = CONCAT71(uStack_397,local_398);
          puVar6[4] = uStack_390;
        }
        else {
          puVar6[1] = local_3a8;
          puVar6[3] = CONCAT71(uStack_397,local_398);
        }
        puVar6[2] = local_3a0;
        local_3a0 = 0;
        local_398 = 0;
        puVar6[5] = lVar11;
        local_3a8 = &local_398;
        __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
    }
    uVar10 = 0;
  }
  do {
    cVar3 = input_stream_t::peek(&this->input);
    bVar13 = (int)cVar3 - 0x30U < 10;
    if (bVar13) {
      cVar3 = input_stream_t::get(&this->input);
      local_358[uVar10 + 1] = cVar3;
      uVar10 = uVar10 + 1;
    }
    else {
      if (!bVar12) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_3e8 = &local_3d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3e8,"Unexpected number end","");
        sVar2 = (this->input).m_processed;
        lVar11 = 0;
        if (sVar2 != 0) {
          lVar11 = sVar2 - 1;
        }
        *puVar6 = &PTR__parser_error_t_001af398;
        puVar6[1] = puVar6 + 3;
        if (local_3e8 == &local_3d8) {
          puVar6[3] = CONCAT71(uStack_3d7,local_3d8);
          puVar6[4] = uStack_3d0;
        }
        else {
          puVar6[1] = local_3e8;
          puVar6[3] = CONCAT71(uStack_3d7,local_3d8);
        }
        puVar6[2] = local_3e0;
        local_3e0 = 0;
        local_3d8 = 0;
        puVar6[5] = lVar11;
        local_3e8 = &local_3d8;
        __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      cVar3 = input_stream_t::peek(&this->input);
      if (cVar3 != '_') {
        if ((1 < uVar10) && (local_358[1] == '0')) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_408 = &local_3f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_408,"Leading zeros are not allowed","");
          sVar2 = (this->input).m_processed;
          *puVar6 = &PTR__parser_error_t_001af398;
          puVar6[1] = puVar6 + 3;
          if (local_408 == &local_3f8) {
            puVar6[3] = CONCAT71(uStack_3f7,local_3f8);
            puVar6[4] = uStack_3f0;
          }
          else {
            puVar6[1] = local_408;
            puVar6[3] = CONCAT71(uStack_3f7,local_3f8);
          }
          puVar6[2] = local_400;
          local_400 = 0;
          local_3f8 = 0;
          puVar6[5] = sVar2 - uVar10;
          local_408 = &local_3f8;
          __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
        }
        cVar3 = input_stream_t::peek(&this->input);
        if (((cVar3 != '.') && (cVar3 = input_stream_t::peek(&this->input), cVar3 != 'e')) &&
           (cVar3 = input_stream_t::peek(&this->input), cVar3 != 'E')) {
          if (uVar10 == 0x13) {
            if (local_358[0] != '-') {
              iVar5 = memcmp(pcVar7,"9223372036854775807",0x13);
              if (0 < iVar5) {
                puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
                local_448 = &local_438;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_448,
                           "The number cannot be represented as 64-bit signed integer","");
                *puVar6 = &PTR__parser_error_t_001af398;
                puVar6[1] = puVar6 + 3;
                if (local_448 == &local_438) {
                  puVar6[3] = CONCAT71(uStack_437,local_438);
                  puVar6[4] = uStack_430;
                }
                else {
                  puVar6[1] = local_448;
                  puVar6[3] = CONCAT71(uStack_437,local_438);
                }
                puVar6[2] = local_440;
                local_440 = 0;
                local_438 = 0;
                puVar6[5] = sVar2;
                local_448 = &local_438;
                __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
              }
              pcVar7 = local_358 + 0x13;
LAB_00150ec8:
              pcVar8 = local_358;
              local_378._M_dataplus._M_p = (pointer)0x0;
              do {
                pcVar1 = pcVar8 + 1;
                pcVar8 = pcVar8 + 1;
                local_378._M_dataplus._M_p =
                     (pointer)((long)*pcVar1 + (long)local_378._M_dataplus._M_p * 10 + -0x30);
              } while (pcVar8 < pcVar7);
              goto LAB_00150eef;
            }
            iVar5 = memcmp(pcVar7,"9223372036854775808",0x13);
            if (0 < iVar5) {
              puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
              local_428 = &local_418;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_428,
                         "The number cannot be represented as 64-bit signed integer","");
              *puVar6 = &PTR__parser_error_t_001af398;
              puVar6[1] = puVar6 + 3;
              if (local_428 == &local_418) {
                puVar6[3] = CONCAT71(uStack_417,local_418);
                puVar6[4] = uStack_410;
              }
              else {
                puVar6[1] = local_428;
                puVar6[3] = CONCAT71(uStack_417,local_418);
              }
              puVar6[2] = local_420;
              local_420 = 0;
              local_418 = 0;
              puVar6[5] = sVar2;
              local_428 = &local_418;
              __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
            }
            pcVar7 = local_358 + 0x13;
LAB_00150e74:
            pcVar8 = local_358;
            local_378._M_dataplus._M_p = (pointer)0x0;
            do {
              pcVar1 = pcVar8 + 1;
              pcVar8 = pcVar8 + 1;
              local_378._M_dataplus._M_p =
                   (pointer)(((long)local_378._M_dataplus._M_p * 10 - (long)*pcVar1) + 0x30);
            } while (pcVar8 < pcVar7);
          }
          else {
            if (0x13 < uVar10) {
              puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
              local_468 = &local_458;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_468,
                         "The number cannot be represented as 64-bit signed integer","");
              *puVar6 = &PTR__parser_error_t_001af398;
              puVar6[1] = puVar6 + 3;
              if (local_468 == &local_458) {
                puVar6[3] = CONCAT71(uStack_457,local_458);
                puVar6[4] = uStack_450;
              }
              else {
                puVar6[1] = local_468;
                puVar6[3] = CONCAT71(uStack_457,local_458);
              }
              puVar6[2] = local_460;
              local_460 = 0;
              local_458 = 0;
              puVar6[5] = sVar2;
              local_468 = &local_458;
              __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
            }
            pcVar7 = local_358 + uVar10;
            if (local_358[0] == '-') {
              if (uVar10 != 0) goto LAB_00150e74;
            }
            else if (uVar10 != 0) goto LAB_00150ec8;
            local_378._M_dataplus._M_p = (pointer)0x0;
          }
LAB_00150eef:
          local_550 = (char *)CONCAT44(local_550._4_4_,0xe);
          std::vector<sax_event_t,std::allocator<sax_event_t>>::
          emplace_back<sax_event_t::type_t,long&>
                    ((vector<sax_event_t,std::allocator<sax_event_t>> *)this->handler,
                     (type_t *)&local_550,(long *)&local_378);
          return integer;
        }
        cVar3 = input_stream_t::peek(&this->input);
        if (cVar3 != '.') goto LAB_00150c26;
        local_358[uVar10 + 1] = '.';
        uVar10 = uVar10 + 1;
        input_stream_t::get(&this->input);
        if (uVar10 == 800) goto LAB_00150bb2;
        bVar12 = false;
        break;
      }
      input_stream_t::get(&this->input);
    }
    bVar12 = bVar13;
    if (uVar10 == 800) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_3c8 = &local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Number is too long","");
      sVar2 = (this->input).m_processed;
      lVar11 = 0;
      if (sVar2 != 0) {
        lVar11 = sVar2 - 1;
      }
      *puVar6 = &PTR__parser_error_t_001af398;
      puVar6[1] = puVar6 + 3;
      if (local_3c8 == &local_3b8) {
        puVar6[3] = CONCAT71(uStack_3b7,local_3b8);
        puVar6[4] = uStack_3b0;
      }
      else {
        puVar6[1] = local_3c8;
        puVar6[3] = CONCAT71(uStack_3b7,local_3b8);
      }
      puVar6[2] = local_3c0;
      local_3c0 = 0;
      local_3b8 = 0;
      puVar6[5] = lVar11;
      local_3c8 = &local_3b8;
      __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
  } while( true );
LAB_00150b58:
  cVar3 = input_stream_t::peek(&this->input);
  bVar13 = (int)cVar3 - 0x30U < 10;
  if (bVar13) {
    cVar3 = input_stream_t::get(&this->input);
    local_358[uVar10 + 1] = cVar3;
    uVar10 = uVar10 + 1;
  }
  else {
    if (!bVar12) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_4a8 = &local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4a8,"Unexpected number end","");
      sVar2 = (this->input).m_processed;
      lVar11 = 0;
      if (sVar2 != 0) {
        lVar11 = sVar2 - 1;
      }
      *puVar6 = &PTR__parser_error_t_001af398;
      puVar6[1] = puVar6 + 3;
      if (local_4a8 == &local_498) {
        puVar6[3] = CONCAT71(uStack_497,local_498);
        puVar6[4] = uStack_490;
      }
      else {
        puVar6[1] = local_4a8;
        puVar6[3] = CONCAT71(uStack_497,local_498);
      }
      puVar6[2] = local_4a0;
      local_4a0 = 0;
      local_498 = 0;
      puVar6[5] = lVar11;
      local_4a8 = &local_498;
      __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    cVar3 = input_stream_t::peek(&this->input);
    if (cVar3 != '_') goto LAB_00150c26;
    input_stream_t::get(&this->input);
  }
  bVar12 = bVar13;
  if (uVar10 == 800) {
LAB_00150bb2:
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_488 = &local_478;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Number is too long","");
    sVar2 = (this->input).m_processed;
    lVar11 = 0;
    if (sVar2 != 0) {
      lVar11 = sVar2 - 1;
    }
    *puVar6 = &PTR__parser_error_t_001af398;
    puVar6[1] = puVar6 + 3;
    if (local_488 == &local_478) {
      puVar6[3] = CONCAT71(uStack_477,local_478);
      puVar6[4] = uStack_470;
    }
    else {
      puVar6[1] = local_488;
      puVar6[3] = CONCAT71(uStack_477,local_478);
    }
    puVar6[2] = local_480;
    local_480 = 0;
    local_478 = 0;
    puVar6[5] = lVar11;
    local_488 = &local_478;
    __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  }
  goto LAB_00150b58;
LAB_00150c26:
  cVar3 = input_stream_t::peek(&this->input);
  if ((cVar3 != 'e') && (cVar3 = input_stream_t::peek(&this->input), cVar3 != 'E')) {
LAB_00150d97:
    local_358[uVar10 + 1] = '\0';
    local_550 = (char *)0x0;
    local_378._M_dataplus._M_p = (pointer)strtod(local_358,(char **)&local_550);
    if (local_550 != local_358 + uVar10 + 1) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_528 = &local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"Bad number","");
      *puVar6 = &PTR__parser_error_t_001af398;
      puVar6[1] = puVar6 + 3;
      if (local_528 == &local_518) {
        puVar6[3] = CONCAT71(uStack_517,local_518);
        puVar6[4] = uStack_510;
      }
      else {
        puVar6[1] = local_528;
        puVar6[3] = CONCAT71(uStack_517,local_518);
      }
      puVar6[2] = local_520;
      local_520 = 0;
      local_518 = 0;
      puVar6[5] = sVar2;
      local_528 = &local_518;
      __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    if ((ulong)ABS((double)local_378._M_dataplus._M_p) < 0x7ff0000000000000) {
      local_37c = floating_point;
      std::vector<sax_event_t,std::allocator<sax_event_t>>::
      emplace_back<sax_event_t::type_t,double&>
                ((vector<sax_event_t,std::allocator<sax_event_t>> *)this->handler,&local_37c,
                 (double *)&local_378);
      return floating_point;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_548 = &local_538;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_548,
               "The number can not be represented as 64-bit floating point number","");
    *puVar6 = &PTR__parser_error_t_001af398;
    puVar6[1] = puVar6 + 3;
    if (local_548 == &local_538) {
      puVar6[3] = CONCAT71(uStack_537,local_538);
      puVar6[4] = uStack_530;
    }
    else {
      puVar6[1] = local_548;
      puVar6[3] = CONCAT71(uStack_537,local_538);
    }
    puVar6[2] = local_540;
    local_540 = 0;
    local_538 = 0;
    puVar6[5] = sVar2;
    local_548 = &local_538;
    __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  }
  cVar3 = input_stream_t::get(&this->input);
  local_358[uVar10 + 1] = cVar3;
  cVar3 = input_stream_t::peek(&this->input);
  if ((cVar3 == '+') || (cVar3 = input_stream_t::peek(&this->input), cVar3 == '-')) {
    cVar3 = input_stream_t::get(&this->input);
    local_358[uVar10 + 2] = cVar3;
    uVar10 = uVar10 + 2;
  }
  else {
    uVar10 = uVar10 + 1;
  }
  cVar3 = input_stream_t::peek(&this->input);
  if (uVar10 != 800) {
    local_388 = (this->input).m_processed;
    uVar9 = 0;
    bVar12 = false;
    do {
      cVar4 = input_stream_t::peek(&this->input);
      bVar13 = (int)cVar4 - 0x30U < 10;
      if (bVar13) {
        cVar4 = input_stream_t::get(&this->input);
        local_358[uVar10 + 1] = cVar4;
        uVar10 = uVar10 + 1;
        uVar9 = uVar9 + 1;
      }
      else {
        if (!bVar12) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_4e8 = &local_4d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4e8,"Unexpected number end","");
          sVar2 = (this->input).m_processed;
          lVar11 = 0;
          if (sVar2 != 0) {
            lVar11 = sVar2 - 1;
          }
          *puVar6 = &PTR__parser_error_t_001af398;
          puVar6[1] = puVar6 + 3;
          if (local_4e8 == &local_4d8) {
            puVar6[3] = CONCAT71(uStack_4d7,local_4d8);
            puVar6[4] = uStack_4d0;
          }
          else {
            puVar6[1] = local_4e8;
            puVar6[3] = CONCAT71(uStack_4d7,local_4d8);
          }
          puVar6[2] = local_4e0;
          local_4e0 = 0;
          local_4d8 = 0;
          puVar6[5] = lVar11;
          local_4e8 = &local_4d8;
          __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
        }
        cVar4 = input_stream_t::peek(&this->input);
        if (cVar4 != '_') {
          if (cVar3 == '0' && 1 < uVar9) {
            puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
            local_508 = &local_4f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_508,"Leading zeros are not allowed in exponent","");
            *puVar6 = &PTR__parser_error_t_001af398;
            puVar6[1] = puVar6 + 3;
            if (local_508 == &local_4f8) {
              puVar6[3] = CONCAT71(uStack_4f7,local_4f8);
              puVar6[4] = uStack_4f0;
            }
            else {
              puVar6[1] = local_508;
              puVar6[3] = CONCAT71(uStack_4f7,local_4f8);
            }
            puVar6[2] = local_500;
            local_500 = 0;
            local_4f8 = 0;
            puVar6[5] = local_388;
            local_508 = &local_4f8;
            __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
          }
          goto LAB_00150d97;
        }
        input_stream_t::get(&this->input);
      }
      bVar12 = bVar13;
    } while (uVar10 != 800);
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_4c8 = &local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Number is too long","");
  sVar2 = (this->input).m_processed;
  lVar11 = 0;
  if (sVar2 != 0) {
    lVar11 = sVar2 - 1;
  }
  *puVar6 = &PTR__parser_error_t_001af398;
  puVar6[1] = puVar6 + 3;
  if (local_4c8 == &local_4b8) {
    puVar6[3] = CONCAT71(uStack_4b7,local_4b8);
    puVar6[4] = uStack_4b0;
  }
  else {
    puVar6[1] = local_4c8;
    puVar6[3] = CONCAT71(uStack_4b7,local_4b8);
  }
  puVar6[2] = local_4c0;
  local_4c0 = 0;
  local_4b8 = 0;
  puVar6[5] = lVar11;
  local_4c8 = &local_4b8;
  __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
}

Assistant:

toml_type_t parse_date_or_number() {
        const std::size_t max_int64_digits = 19;
        const char *max_int64_string = "9223372036854775807";
        const char *min_int64_string = "9223372036854775808";

        const std::size_t max_double_length = 800;

        std::size_t value_offset = input.processed();

        char buffer[max_double_length + 1];
        buffer[0] = '+';
        char *digits = buffer + 1;

        std::size_t next_index = 0;

        if (std::isdigit(input.peek())) {
            digits[next_index++] = input.get();
            if (std::isdigit(input.peek())) {
                digits[next_index++] = input.get();
                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    if (std::isdigit(input.peek())) {
                        digits[next_index++] = input.get();

                        if (input.peek() == '-') {
                            digits[next_index++] = input.get();

                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars("-");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars("tT");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars(":");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars(":");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();

                            if (input.peek() == '.') {
                                digits[next_index++] = input.get();
                                digits[next_index++] = parse_datetime_digit();

                                while (std::isdigit(input.peek())) {
                                    digits[next_index++] = input.get();
                                }
                            }

                            if (input.peek() == 'z' || input.peek() == 'Z') {
                                digits[next_index++] = input.get();
                            } else {
                                digits[next_index++] = parse_chars("+-");
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_chars(":");
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_datetime_digit();
                            }

                            handler.datetime(std::string(digits, digits + next_index));
                            return toml_type_t::datetime;
                        }
                    }
                }
            }
        } else if (input.peek() == '-') {
            input.get();
            buffer[0] = '-';
        } else if (input.peek() == '+') {
            input.get();
        } else {
            input.get();
            throw parser_error_t("Unexpected character", last_char_offset());
        }

        bool last_digit = next_index > 0;
        while (true) {
            if (next_index == max_double_length) {
                throw parser_error_t("Number is too long", last_char_offset());
            }

            if (std::isdigit(input.peek())) {
                digits[next_index++] = input.get();
                last_digit = true;
            } else if (last_digit && input.peek() == '_') {
                input.get();
                last_digit = false;
            } else {
                break;
            }
        }

        if (!last_digit) {
            throw parser_error_t("Unexpected number end", last_char_offset());
        }

        if (digits[0] == '0' && next_index > 1) {
            throw parser_error_t("Leading zeros are not allowed", input.processed() - next_index);
        }

        if (input.peek() != '.' && input.peek() != 'e' && input.peek() != 'E') {
            if (next_index == max_int64_digits)
            {
                if (buffer[0] == '-' && strncmp(digits, min_int64_string, max_int64_digits) > 0) {
                    throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                         value_offset);
                }

                if (buffer[0] != '-' && strncmp(digits, max_int64_string, max_int64_digits) > 0) {
                    throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                         value_offset);
                }
            } else if (next_index > max_int64_digits) {
                throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                     value_offset);
            }

            std::int64_t result = 0;

            if (buffer[0] == '-') {
                for (auto it = digits; it < digits + next_index; ++it) {
                    result = 10 * result - (*it - '0');
                }
            } else {
                for (auto it = digits; it < digits + next_index; ++it) {
                    result = 10 * result + (*it - '0');
                }
            }

            handler.integer(result);
            return toml_type_t::integer;
        }

        if (input.peek() == '.') {
            digits[next_index++] = '.';
            input.get();

            last_digit = false;
            while (true) {
                if (next_index == max_double_length) {
                    throw parser_error_t("Number is too long", last_char_offset());
                }

                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    last_digit = true;
                } else if (last_digit && input.peek() == '_') {
                    input.get();
                    last_digit = false;
                } else {
                    break;
                }
            }

            if (!last_digit) {
                throw parser_error_t("Unexpected number end", last_char_offset());
            }
        }

        if (input.peek() == 'e' || input.peek() == 'E') {
            digits[next_index++] = input.get();

            if (input.peek() == '+' || input.peek() == '-') {
                digits[next_index++] = input.get();
            }

            char first_digit = input.peek();
            std::size_t exponent_start = input.processed();
            std::size_t exponent_size = 0;
            last_digit = false;
            while (true) {
                if (next_index == max_double_length) {
                    throw parser_error_t("Number is too long", last_char_offset());
                }

                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    last_digit = true;
                    ++exponent_size;
                } else if (last_digit && input.peek() == '_') {
                    input.get();
                    last_digit = false;
                } else {
                    break;
                }
            }

            if (!last_digit) {
                throw parser_error_t("Unexpected number end", last_char_offset());
            }

            if (exponent_size > 1 && first_digit == '0') {
                throw parser_error_t("Leading zeros are not allowed in exponent", exponent_start);
            }
        }

        digits[next_index] = '\0';
        char *end = nullptr;
        double result = std::strtod(buffer, &end);

        if (end != digits + next_index) {
            throw parser_error_t("Bad number", value_offset);
        }

        if (std::isnan(result) || std::isinf(result)) {
            throw parser_error_t("The number can not be represented as 64-bit floating point number",
                                 value_offset);
        }

        handler.floating_point(result);
        return toml_type_t::floating_point;
    }